

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::Image::Image
          (Image *this,Type *type,Dim dimen,uint32_t d,bool array,bool multisample,uint32_t sampling
          ,ImageFormat f,AccessQualifier qualifier)

{
  bool multisample_local;
  bool array_local;
  uint32_t d_local;
  Dim dimen_local;
  Type *type_local;
  Image *this_local;
  
  analysis::Type::Type(&this->super_Type,kImage);
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Image_010e8918;
  this->sampled_type_ = type;
  this->dim_ = dimen;
  this->depth_ = d;
  this->arrayed_ = array;
  this->ms_ = multisample;
  this->sampled_ = sampling;
  this->format_ = f;
  this->access_qualifier_ = qualifier;
  return;
}

Assistant:

Image::Image(Type* type, spv::Dim dimen, uint32_t d, bool array,
             bool multisample, uint32_t sampling, spv::ImageFormat f,
             spv::AccessQualifier qualifier)
    : Type(kImage),
      sampled_type_(type),
      dim_(dimen),
      depth_(d),
      arrayed_(array),
      ms_(multisample),
      sampled_(sampling),
      format_(f),
      access_qualifier_(qualifier) {
  // TODO(antiagainst): check sampled_type
}